

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O2

char * __thiscall MeCab::anon_unknown_0::TaggerImpl::next(TaggerImpl *this,char *out,size_t len2)

{
  int iVar1;
  Lattice *pLVar2;
  undefined4 extraout_var;
  
  pLVar2 = mutable_lattice(this);
  iVar1 = (*pLVar2->_vptr_Lattice[0x10])(pLVar2);
  if ((char)iVar1 == '\0') {
    (*pLVar2->_vptr_Lattice[0x25])(pLVar2,"no more results");
  }
  else {
    iVar1 = (*pLVar2->_vptr_Lattice[0x1b])(pLVar2,out,len2);
    if ((char *)CONCAT44(extraout_var,iVar1) != (char *)0x0) {
      return (char *)CONCAT44(extraout_var,iVar1);
    }
    (*pLVar2->_vptr_Lattice[0x24])(pLVar2);
    std::__cxx11::string::assign((char *)&this->what_);
  }
  return (char *)0x0;
}

Assistant:

const char* TaggerImpl::next(char *out, size_t len2) {
  Lattice *lattice = mutable_lattice();
  if (!lattice->next()) {
    lattice->set_what("no more results");
    return 0;
  }
  const char *result = lattice->toString(out, len2);
  if (!result) {
    set_what(lattice->what());
    return 0;
  }
  return result;
}